

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_partition_iterator.h
# Opt level: O2

void __thiscall
Gudhi::coxeter_triangulation::Set_partition_iterator::update_value(Set_partition_iterator *this)

{
  uint uVar1;
  undefined8 in_RAX;
  pointer *ppuVar2;
  ulong uVar3;
  undefined8 uStack_18;
  
  uVar1 = this->k_;
  ppuVar2 = (pointer *)
            ((long)&(((this->value_).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl + 8);
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    if (*ppuVar2 != ((_Vector_impl_data *)(ppuVar2 + -1))->_M_start) {
      *ppuVar2 = ((_Vector_impl_data *)(ppuVar2 + -1))->_M_start;
    }
    ppuVar2 = ppuVar2 + 3;
  }
  uVar1 = 0;
  uStack_18 = in_RAX;
  while (uStack_18 = CONCAT44(uVar1,(undefined4)uStack_18), uVar1 < this->n_) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((this->value_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               (this->rgs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar1],
               (value_type_conflict3 *)((long)&uStack_18 + 4));
    uVar1 = uStack_18._4_4_ + 1;
  }
  return;
}

Assistant:

void update_value() {
    for (uint i = 0; i < k_; i++) value_[i].clear();
    for (uint i = 0; i < n_; i++) value_[rgs_[i]].push_back(i);
  }